

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void edition_unittest::Int32ParseTester::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  Int32ParseTester **v1;
  Int32ParseTester **v2;
  char *failure_msg;
  LogMessage *pLVar2;
  RepeatedField<int> *pRVar3;
  RepeatedField<int> *pRVar4;
  uint32_t *puVar5;
  anon_union_192_1_493b367e_for_Int32ParseTester_9 *this;
  Int32ParseTester *extendee;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  Int32ParseTester *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Int32ParseTester *from;
  Int32ParseTester *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (Int32ParseTester *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (Int32ParseTester *)to_msg;
  _this = (Int32ParseTester *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<edition_unittest::Int32ParseTester_const*>(&local_38);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<edition_unittest::Int32ParseTester*>
                 (&from);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<edition_unittest::Int32ParseTester_const*,edition_unittest::Int32ParseTester*>
                       (v1,v2,"&from != _this");
  if (local_30 == (Nullable<const_char_*>)0x0) {
    pRVar3 = _internal_mutable_repeated_int32_lowfield(from);
    pRVar4 = _internal_repeated_int32_lowfield
                       ((Int32ParseTester *)absl_log_internal_check_op_result);
    google::protobuf::RepeatedField<int>::MergeFrom(pRVar3,pRVar4);
    pRVar3 = _internal_mutable_packed_int32_lowfield(from);
    pRVar4 = _internal_packed_int32_lowfield((Int32ParseTester *)absl_log_internal_check_op_result);
    google::protobuf::RepeatedField<int>::MergeFrom(pRVar3,pRVar4);
    pRVar3 = _internal_mutable_repeated_int32_midfield(from);
    pRVar4 = _internal_repeated_int32_midfield
                       ((Int32ParseTester *)absl_log_internal_check_op_result);
    google::protobuf::RepeatedField<int>::MergeFrom(pRVar3,pRVar4);
    pRVar3 = _internal_mutable_packed_int32_midfield(from);
    pRVar4 = _internal_packed_int32_midfield((Int32ParseTester *)absl_log_internal_check_op_result);
    google::protobuf::RepeatedField<int>::MergeFrom(pRVar3,pRVar4);
    pRVar3 = _internal_mutable_repeated_int32_hifield(from);
    pRVar4 = _internal_repeated_int32_hifield((Int32ParseTester *)absl_log_internal_check_op_result)
    ;
    google::protobuf::RepeatedField<int>::MergeFrom(pRVar3,pRVar4);
    pRVar3 = _internal_mutable_packed_int32_hifield(from);
    pRVar4 = _internal_packed_int32_hifield((Int32ParseTester *)absl_log_internal_check_op_result);
    google::protobuf::RepeatedField<int>::MergeFrom(pRVar3,pRVar4);
    puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                       ((HasBits<1> *)(absl_log_internal_check_op_result + 0x28),0);
    uVar1 = *puVar5;
    if ((uVar1 & 0xf) != 0) {
      if ((uVar1 & 1) != 0) {
        (from->field_0)._impl_.optional_int32_lowfield_ =
             *(int32_t *)(absl_log_internal_check_op_result + 0xbc);
      }
      if ((uVar1 & 2) != 0) {
        (from->field_0)._impl_.optional_int32_midfield_ =
             *(int32_t *)(absl_log_internal_check_op_result + 0xc0);
      }
      if ((uVar1 & 4) != 0) {
        (from->field_0)._impl_.other_field_ = *(int32_t *)(absl_log_internal_check_op_result + 0xc4)
        ;
      }
      if ((uVar1 & 8) != 0) {
        (from->field_0)._impl_.optional_int32_hifield_ =
             *(int32_t *)(absl_log_internal_check_op_result + 200);
      }
    }
    puVar5 = google::protobuf::internal::HasBits<1>::operator[]
                       (&(from->field_0)._impl_._has_bits_,0);
    *puVar5 = uVar1 | *puVar5;
    this = &from->field_0;
    extendee = default_instance();
    google::protobuf::internal::ExtensionSet::MergeFrom
              (&(this->_impl_)._extensions_,(MessageLite *)extendee,
               (ExtensionSet *)(absl_log_internal_check_op_result + 0x10));
    google::protobuf::internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(from->super_Message).super_MessageLite._internal_metadata_,
               (InternalMetadata *)(absl_log_internal_check_op_result + 8));
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/edition_unittest.pb.cc"
             ,0xd6c0,failure_msg);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_50);
}

Assistant:

void Int32ParseTester::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<Int32ParseTester*>(&to_msg);
  auto& from = static_cast<const Int32ParseTester&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.Int32ParseTester)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_repeated_int32_lowfield()->MergeFrom(from._internal_repeated_int32_lowfield());
  _this->_internal_mutable_packed_int32_lowfield()->MergeFrom(from._internal_packed_int32_lowfield());
  _this->_internal_mutable_repeated_int32_midfield()->MergeFrom(from._internal_repeated_int32_midfield());
  _this->_internal_mutable_packed_int32_midfield()->MergeFrom(from._internal_packed_int32_midfield());
  _this->_internal_mutable_repeated_int32_hifield()->MergeFrom(from._internal_repeated_int32_hifield());
  _this->_internal_mutable_packed_int32_hifield()->MergeFrom(from._internal_packed_int32_hifield());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000000fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_impl_.optional_int32_lowfield_ = from._impl_.optional_int32_lowfield_;
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_impl_.optional_int32_midfield_ = from._impl_.optional_int32_midfield_;
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.other_field_ = from._impl_.other_field_;
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_impl_.optional_int32_hifield_ = from._impl_.optional_int32_hifield_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}